

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.c
# Opt level: O0

int ndn_signature_value_tlv_decode(ndn_decoder_t *decoder,ndn_signature_t *signature)

{
  uint32_t local_28;
  int local_24;
  uint32_t probe;
  int ret_val;
  ndn_signature_t *signature_local;
  ndn_decoder_t *decoder_local;
  
  local_24 = 0xffffffff;
  local_28 = 0;
  _probe = signature;
  signature_local = (ndn_signature_t *)decoder;
  local_24 = decoder_get_type(decoder,&local_28);
  decoder_local._4_4_ = local_24;
  if (local_24 == 0) {
    if (local_28 == 0x17) {
      _probe->is_interest = false;
    }
    else {
      if (local_28 != 0x2e) {
        return -0xc;
      }
      _probe->is_interest = true;
    }
    local_24 = decoder_get_length((ndn_decoder_t *)signature_local,&local_28);
    if (local_28 < 0x49) {
      if (local_28 < 0x20) {
        decoder_local._4_4_ = -0xd;
      }
      else {
        _probe->sig_size = local_28;
        decoder_local._4_4_ =
             decoder_get_raw_buffer_value
                       ((ndn_decoder_t *)signature_local,_probe->sig_value,_probe->sig_size);
        if (decoder_local._4_4_ == 0) {
          decoder_local._4_4_ = 0;
        }
      }
    }
    else {
      decoder_local._4_4_ = -0xd;
    }
  }
  return decoder_local._4_4_;
}

Assistant:

int
ndn_signature_value_tlv_decode(ndn_decoder_t* decoder, ndn_signature_t* signature)
{
  int ret_val = -1;
  uint32_t probe = 0;
  ret_val = decoder_get_type(decoder, &probe);
  if (ret_val != NDN_SUCCESS) return ret_val;
  if (probe == TLV_SignatureValue) {
    signature->is_interest = false;
  }
  else if (probe == TLV_InterestSignatureValue) {
    signature->is_interest = true;
  }
  else {
    return NDN_WRONG_TLV_TYPE;
  }
  ret_val = decoder_get_length(decoder, &probe);
  if (probe > NDN_SEC_MAX_SIG_SIZE)
    return NDN_WRONG_TLV_LENGTH;
  if (probe < NDN_SEC_MIN_SIG_SIZE)
    return NDN_WRONG_TLV_LENGTH;
  signature->sig_size = probe;
  ret_val = decoder_get_raw_buffer_value(decoder, signature->sig_value, signature->sig_size);
  if (ret_val != NDN_SUCCESS) return ret_val;
  return 0;
}